

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

void __thiscall Js::JavascriptLibrary::EndDynamicFunctionReferences(JavascriptLibrary *this)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((this->dynamicFunctionReference).ptr ==
      (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1cd0,"(this->dynamicFunctionReference != nullptr)",
                                "this->dynamicFunctionReference != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pTVar1 = &this->dynamicFunctionReferenceDepth;
  *pTVar1 = *pTVar1 - 1;
  if (*pTVar1 != 0) {
    return;
  }
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>::Clear
            ((this->dynamicFunctionReference).ptr);
  return;
}

Assistant:

void JavascriptLibrary::EndDynamicFunctionReferences()
    {
        Assert(this->dynamicFunctionReference != nullptr);

        this->dynamicFunctionReferenceDepth--;

        if (this->dynamicFunctionReferenceDepth == 0)
        {
            this->dynamicFunctionReference->Clear();
        }
    }